

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  FormatSpec<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_> local_18;
  
  local_18.super_type.spec_.data_ =
       "The custom JSON name of field \"%s\" (\"%s\") is invalid: JSON names may not start with \'[\' and end with \']\'."
  ;
  local_18.super_type.spec_.size_ = 0x69;
  StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (__return_storage_ptr__,&local_18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(ulong *)(*(long *)this + 0x18) & 0xfffffffffffffffc),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(this + 8) + 8));
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}